

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O3

void listelem_stats(listelem_alloc_t *list)

{
  glist_t pgVar1;
  listelem_alloc_t *plVar2;
  long lVar3;
  glist_t pgVar4;
  glist_t *ppgVar5;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x119,"Linklist stats:\n");
  lVar3 = -1;
  plVar2 = list;
  do {
    plVar2 = (listelem_alloc_t *)plVar2->freelist;
    lVar3 = lVar3 + 1;
  } while (plVar2 != (listelem_alloc_t *)0x0);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x121,"elemsize %lu, #alloc %lu, #freed %lu, #freelist %lu\n",list->elemsize,
          list->n_alloc,list->n_freed,lVar3);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x122,"Allocated blocks:\n");
  pgVar4 = list->blocks;
  if (pgVar4 != (glist_t)0x0) {
    ppgVar5 = &list->blocksize;
    do {
      pgVar1 = *ppgVar5;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
              ,0x125,"%p (%d * %d bytes)\n",(pgVar4->data).ptr,(pgVar1->data).ptr,list->elemsize);
      ppgVar5 = &pgVar1->next;
      pgVar4 = pgVar4->next;
    } while (pgVar4 != (gnode_s *)0x0);
  }
  return;
}

Assistant:

void
listelem_stats(listelem_alloc_t *list)
{
    gnode_t *gn, *gn2;
    char **cpp;
    size_t n;

    E_INFO("Linklist stats:\n");
    for (n = 0, cpp = list->freelist; cpp;
         cpp = (char **) (*cpp), n++);
    E_INFO
        ("elemsize %lu, #alloc %lu, #freed %lu, #freelist %lu\n",
         (unsigned long)list->elemsize,
         (unsigned long)list->n_alloc,
         (unsigned long)list->n_freed,
         (unsigned long)n);
    E_INFO("Allocated blocks:\n");
    gn2 = list->blocksize;
    for (gn = list->blocks; gn; gn = gnode_next(gn)) {
	E_INFO("%p (%d * %d bytes)\n", gnode_ptr(gn), gnode_int32(gn2), list->elemsize);
        gn2 = gnode_next(gn2);
    }
}